

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initWinDeployQtTool(VcprojGenerator *this)

{
  byte bVar1;
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  VCConfiguration *conf;
  char16_t *str;
  char16_t *str_1;
  QString commandLine;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffd30;
  QMakeProject *this_00;
  QMakeProject *in_stack_fffffffffffffd38;
  MakefileGenerator *this_01;
  ProKey *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd58;
  char16_t **a;
  QArrayDataPointer<char16_t> local_248 [5];
  QLatin1Char local_1bb [82];
  QLatin1Char local_169 [121];
  undefined1 local_f0 [48];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  QArrayDataPointer<char16_t> local_a8 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = &in_RDI->m_tmp[0].d.ptr;
  *(undefined1 *)&in_RDI[6].m_qmakespec.d.d = 1;
  QString::QString((QString *)in_stack_fffffffffffffd38,(char *)in_RDI);
  bVar1 = QMakeProject::isActiveConfig
                    (in_stack_fffffffffffffd38,(QString *)in_stack_fffffffffffffd30,
                     (bool)in_stack_fffffffffffffd2f);
  QString::~QString((QString *)0x298361);
  if ((bVar1 & 1) != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_a8,(Data *)0x0,L"$(TargetName).windeployqt.$(Platform).$(Configuration)",0x36);
    QString::QString((QString *)in_stack_fffffffffffffd30,
                     (DataPointer *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    QString::operator=((QString *)in_stack_fffffffffffffd30,
                       (QString *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    QString::~QString((QString *)0x2983eb);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd30);
    local_c0 = 0xaaaaaaaaaaaaaaaa;
    local_b8 = 0xaaaaaaaaaaaaaaaa;
    local_b0 = 0xaaaaaaaaaaaaaaaa;
    this_00 = (QMakeProject *)(in_RDI->m_superfile).d.size;
    ProKey::ProKey((ProKey *)this_00,
                   (char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    QMakeEvaluator::first(in_RDI,in_stack_fffffffffffffd40);
    ProString::toQString((ProString *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28))
    ;
    QDir::toNativeSeparators((QString *)local_f0);
    MakefileGenerator::shellQuote((MakefileGenerator *)in_stack_fffffffffffffd38,(QString *)this_00)
    ;
    QLatin1Char::QLatin1Char(local_169,' ');
    ::operator+((QString *)in_stack_fffffffffffffd38,(QLatin1Char *)this_00);
    this_01 = (MakefileGenerator *)(in_RDI->m_superfile).d.size;
    ProKey::ProKey((ProKey *)this_00,
                   (char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    QMakeProject::values
              (this_00,(ProKey *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    QLatin1Char::QLatin1Char(local_1bb,' ');
    QChar::QChar<QLatin1Char,_true>((QChar *)this_00,(QLatin1Char)(char)((ulong)this_01 >> 0x38));
    ProStringList::join((ProStringList *)
                        CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                        (QChar)(char16_t)((ulong)this_01 >> 0x30));
    ::operator+((QStringBuilder<QString,_QLatin1Char> *)this_01,(QString *)this_00);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString> *)
               CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString> *)this_00);
    QString::~QString((QString *)0x2985a0);
    ProKey::~ProKey((ProKey *)0x2985ad);
    QStringBuilder<QString,_QLatin1Char>::~QStringBuilder
              ((QStringBuilder<QString,_QLatin1Char> *)0x2985ba);
    QString::~QString((QString *)0x2985c7);
    QString::~QString((QString *)0x2985d4);
    QString::~QString((QString *)0x2985e1);
    ProString::~ProString((ProString *)0x2985ee);
    ProKey::~ProKey((ProKey *)0x2985fb);
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_248,(Data *)0x0,
               L" -list relative -dir \"$(MSBuildProjectDirectory)\" \"$(OutDir)\\$(TargetFileName)\" > "
               ,0x52);
    QString::QString((QString *)this_00,
                     (DataPointer *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    ::operator+((QString *)this_01,(QString *)this_00);
    MakefileGenerator::shellQuote(this_01,(QString *)this_00);
    ::operator+((QStringBuilder<const_QString_&,_QString> *)this_01,(QString *)this_00);
    ::operator+=((QString *)a,
                 (QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffd58));
    QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *)this_00);
    QString::~QString((QString *)0x2986d8);
    QStringBuilder<const_QString_&,_QString>::~QStringBuilder
              ((QStringBuilder<const_QString_&,_QString> *)0x2986e5);
    QString::~QString((QString *)0x2986f2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
    a[0x1cb] = (char16_t *)&in_RDI->m_tmp[0].d.ptr;
    *(undefined1 *)(a + 0x1ca) = 0;
    QString::~QString((QString *)0x298737);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VcprojGenerator::initWinDeployQtTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    conf.windeployqt.ExcludedFromBuild = true;
    if (project->isActiveConfig("windeployqt")) {
        conf.windeployqt.Record = QStringLiteral("$(TargetName).windeployqt.$(Platform).$(Configuration)");
        const QString commandLine = MakefileGenerator::shellQuote(QDir::toNativeSeparators(project->first("QMAKE_WINDEPLOYQT").toQString()))
                + QLatin1Char(' ') + project->values("WINDEPLOYQT_OPTIONS").join(QLatin1Char(' '));

        //  Visual Studio copies all files to be deployed into the MSIL directory
        //  and then invokes MDILXapCompile on it, which checks for managed code and
        //  translates it into native code. The problem is that all entries of the
        //  package will be copied into the MSIL directly, losing the subdirectory
        //  structure (for instance for plugins). However, the MDILXapCompile call
        //  itself contains the original subdirectories as parameters and hence the
        //  call fails.
        //  Hence the only way to get a build done is to recreate the directory
        //  structure manually by invoking windeployqt a second time, so that
        //  the MDILXapCompile call succeeds and deployment continues.
        conf.windeployqt.CommandLine += commandLine
                + QStringLiteral(" -list relative -dir \"$(MSBuildProjectDirectory)\" \"$(OutDir)\\$(TargetFileName)\" > ")
                + MakefileGenerator::shellQuote(conf.windeployqt.Record);
        conf.windeployqt.config = &vcProject.Configuration;
        conf.windeployqt.ExcludedFromBuild = false;
    }
}